

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O3

void __thiscall
ParseNodeExportDefault::ParseNodeExportDefault
          (ParseNodeExportDefault *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  (this->super_ParseNode).nop = nop;
  (this->super_ParseNode).grfpn = 0;
  (this->super_ParseNode).location = 0xffffffff;
  (this->super_ParseNode).field_0x1 = ((this->super_ParseNode).field_0x1 & 0xe0) + 1;
  (this->super_ParseNode).ichMin = ichMin;
  (this->super_ParseNode).ichLim = ichLim;
  return;
}

Assistant:

ParseNodeExportDefault::ParseNodeExportDefault(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNode(nop, ichMin, ichLim)
{
}